

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook_test.cc
# Opt level: O1

void MultithreadedTestThreadRunner(int thread_num)

{
  undefined1 local_30 [8];
  unique_lock<std::mutex> ml;
  
  local_30 = (undefined1  [8])&threadcount_lock;
  ml._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_30);
  ml._M_device._0_1_ = 1;
  num_threads_remaining = num_threads_remaining + -1;
  while (num_threads_remaining != 0) {
    std::condition_variable::wait((unique_lock *)threadcount_ready);
  }
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  MultithreadedTestThread(&list,3,thread_num);
  return;
}

Assistant:

void MultithreadedTestThreadRunner(int thread_num) {
  // Wait for all threads to start running.
  {
    std::unique_lock ml{threadcount_lock};

    assert(num_threads_remaining > 0);
    --num_threads_remaining;

    threadcount_ready.wait(ml, [&] () { return num_threads_remaining == 0; });
    // the last thread to decrement to 0 will wake everyone
    threadcount_ready.notify_all();
  }

  // shift is the smallest number such that (1<<shift) > kHookListMaxValues
  int shift = 0;
  for (int i = kHookListMaxValues; i > 0; i >>= 1) {
    shift += 1;
  }

  MultithreadedTestThread(&list, shift, thread_num);
}